

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugUtilities.hpp
# Opt level: O2

void CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(IBuffer *pSrcPtr)

{
  _func_int **pp_Var1;
  char *in_stack_ffffffffffffffb8;
  undefined1 local_39;
  char *local_38;
  char *local_30;
  string msg;
  
  if ((pSrcPtr != (IBuffer *)0x0) &&
     (pp_Var1 = (pSrcPtr->super_IDeviceObject).super_IObject._vptr_IObject,
     pp_Var1 != (_func_int **)&PTR_QueryInterface_00891240)) {
    local_30 = *(char **)(pp_Var1[-1] + 8);
    local_30 = local_30 + (*local_30 == '*');
    local_38 = "N8Diligent12BufferVkImplE";
    local_39 = 0x27;
    Diligent::FormatString<char[40],char_const*,char[16],char_const*,char>
              (&msg,(Diligent *)"Dynamic type cast failed. Src typeid: \'",(char (*) [40])&local_30,
               (char **)"\' Dst typeid: \'",(char (*) [16])&local_38,(char **)&local_39,
               in_stack_ffffffffffffffb8);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"CheckDynamicType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Platforms/Basic/interface/DebugUtilities.hpp"
               ,0x3f);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void CheckDynamicType(SrcType* pSrcPtr)
{
    VERIFY(pSrcPtr == nullptr || dynamic_cast<DstType*>(pSrcPtr) != nullptr, "Dynamic type cast failed. Src typeid: \'", typeid(*pSrcPtr).name(), "\' Dst typeid: \'", typeid(DstType).name(), '\'');
}